

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.cc
# Opt level: O2

void Imageio::catalogBuiltinPlugins(void)

{
  allocator<char> local_29;
  string local_28;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"exr",&local_29);
  declareImageioFormat(&local_28,exrInputCreate,exrInputExtensions,(Creator)0x0,(char **)0x0);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"jpeg",&local_29);
  declareImageioFormat(&local_28,jpegInputCreate,jpegInputExtensions,(Creator)0x0,(char **)0x0);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"npbm",&local_29);
  declareImageioFormat(&local_28,npbmInputCreate,npbmInputExtensions,(Creator)0x0,(char **)0x0);
  ::std::__cxx11::string::~string((string *)&local_28);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"png",&local_29);
  declareImageioFormat
            (&local_28,pngInputCreate,pngInputExtensions,pngOutputCreate,pngOutputExtensions);
  ::std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void
catalogBuiltinPlugins()
{
#define DECLAREPLUG(name)                                      \
        declareImageioFormat(                                  \
            #name, (ImageInput::Creator)name##InputCreate,     \
            name##InputExtensions,                             \
            (ImageOutput::Creator)name##OutputCreate,          \
            name##OutputExtensions)
#define DECLAREPLUG_RO(name)                                   \
        declareImageioFormat(                                  \
            #name, (ImageInput::Creator)name##InputCreate,     \
            name##InputExtensions,                             \
            nullptr, nullptr)
#define DECLAREPLUG_WO(name)                                   \
        declareImageioFormat(                                  \
            nullptr, nullptr,                                  \
            #name, (ImageOutput::Creator)name##OutputCreate,   \
            name##OutputExtensions)

#if !defined(DISABLE_OPENEXR)
    DECLAREPLUG_RO (exr);
#endif
#if !defined(DISABLE_JPEG)
    DECLAREPLUG_RO(jpeg);
#endif
#if !defined(DISABLE_NPBM)
    DECLAREPLUG_RO (npbm);
#endif
#if !defined(DISABLE_PNG)
    DECLAREPLUG (png);
#endif
    // 'Raw' format is not in the catalog as an explicit API is a better fit
}